

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Degree_Generator.cc
# Opt level: O3

int __thiscall Degree_Generator::deg_generator(Degree_Generator *this,int v)

{
  uint32_t uVar1;
  long lVar2;
  
  uVar1 = 0xffffffff;
  if ((uint)v < 0x100000) {
    lVar2 = 0;
    do {
      if ((f_table[lVar2] <= (uint)v) && ((uint)v < f_table[lVar2 + 1])) goto LAB_00114dab;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
    lVar2 = 7;
LAB_00114dab:
    uVar1 = d_table[lVar2];
  }
  return uVar1;
}

Assistant:

int Degree_Generator::deg_generator(int v)
{
	int index_d = 0;
	int deg = 0;
	// v is a non-negative integer that is less than 2^^20 = 1048576
	// please refer to rfc6330 5.3.5.2 degree generator
	if ((v >= 1048576) || (v < 0) )
	{
		return -1;
	}

	// choose the degree: lookup the f_tabole
	for(index_d = 1; index_d < 8; index_d++)
	{
		if((f_table[index_d - 1] <= v) && (v < f_table[index_d]))
		{
		     break;
		}
	}

	if (index_d > 8)
	{
		std::cerr << "Inconsistent table state" << std::endl;
	}

	deg = d_table[index_d - 1];

	return deg;

}